

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.cpp
# Opt level: O0

bool __thiscall llbuild::basic::FileSystem::createDirectories(FileSystem *this,string *path)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  StringRef path_00;
  byte local_89;
  string local_78;
  path *local_58;
  undefined1 local_48 [8];
  StringRef parent;
  string *path_local;
  FileSystem *this_local;
  
  parent.Length = (size_t)path;
  uVar1 = (*this->_vptr_FileSystem[2])(this,path);
  if ((uVar1 & 1) == 0) {
    local_58 = (path *)std::__cxx11::string::data();
    pcVar3 = (char *)std::__cxx11::string::length();
    path_00.Length = 2;
    path_00.Data = pcVar3;
    _local_48 = llvm::sys::path::parent_path(local_58,path_00,(Style)pcVar3);
    if (parent.Data == (char *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      llvm::StringRef::operator_cast_to_string(&local_78,(StringRef *)local_48);
      uVar1 = (*this->_vptr_FileSystem[3])(this,&local_78);
      local_89 = 0;
      if ((uVar1 & 1) != 0) {
        iVar2 = (*this->_vptr_FileSystem[2])(this,parent.Length);
        local_89 = (byte)iVar2;
      }
      this_local._7_1_ = (bool)(local_89 & 1);
      std::__cxx11::string::~string((string *)&local_78);
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool FileSystem::createDirectories(const std::string& path) {
  // Attempt to create the final directory first, to optimize for the common
  // case where we don't need to recurse.
  if (createDirectory(path))
    return true;

  // If that failed, attempt to create the parent.
  StringRef parent = llvm::sys::path::parent_path(path);
  if (parent.empty())
    return false;
  return createDirectories(parent) && createDirectory(path);
}